

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TracingServiceImpl::UpdateDataSource
          (TracingServiceImpl *this,ProducerID producer_id,DataSourceDescriptor *new_desc)

{
  _Base_ptr p_Var1;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>
  it;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>
  _Var2;
  char *pcVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>_>
  pVar4;
  
  if (new_desc->id_ == 0) {
    pcVar3 = base::Basename(
                           "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                           );
    base::LogMessage(kLogError,pcVar3,0xe4bb,"UpdateDataSource() must have a non-zero id");
    return;
  }
  pVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>_>
          ::equal_range(&(this->data_sources_)._M_t,&new_desc->name_);
  _Var2 = pVar4.first._M_node;
  p_Var1 = (_Base_ptr)new_desc->id_;
  while( true ) {
    if (_Var2._M_node == pVar4.second._M_node._M_node) {
      pcVar3 = base::Basename(
                             "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                             );
      base::LogMessage(kLogError,pcVar3,0xe4cf,
                       "UpdateDataSource() failed, could not find an existing data source with name=\"%s\" id=%lu"
                       ,(new_desc->name_)._M_dataplus._M_p,new_desc->id_);
      return;
    }
    if (((short)_Var2._M_node[2]._M_color == producer_id) && (_Var2._M_node[3]._M_left == p_Var1))
    break;
    _Var2._M_node = (_Base_ptr)::std::_Rb_tree_increment(_Var2._M_node);
  }
  protos::gen::DataSourceDescriptor::operator=
            ((DataSourceDescriptor *)&_Var2._M_node[2]._M_parent,new_desc);
  return;
}

Assistant:

void TracingServiceImpl::UpdateDataSource(
    ProducerID producer_id,
    const DataSourceDescriptor& new_desc) {
  if (new_desc.id() == 0) {
    PERFETTO_ELOG("UpdateDataSource() must have a non-zero id");
    return;
  }

  // If this producer has already registered a matching descriptor name and id,
  // just update the descriptor.
  RegisteredDataSource* data_source = nullptr;
  auto range = data_sources_.equal_range(new_desc.name());
  for (auto it = range.first; it != range.second; ++it) {
    if (it->second.producer_id == producer_id &&
        it->second.descriptor.id() == new_desc.id()) {
      data_source = &it->second;
      break;
    }
  }

  if (!data_source) {
    PERFETTO_ELOG(
        "UpdateDataSource() failed, could not find an existing data source "
        "with name=\"%s\" id=%" PRIu64,
        new_desc.name().c_str(), new_desc.id());
    return;
  }

  data_source->descriptor = new_desc;
}